

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O3

bool __thiscall
kernel::BlockTreeDB::LoadBlockIndexGuts
          (BlockTreeDB *this,Params *consensusParams,
          function<CBlockIndex_*(const_uint256_&)> insertBlockIndex,SignalInterrupt *interrupt)

{
  long lVar1;
  long lVar2;
  uint256 *puVar3;
  string_view source_file;
  string_view source_file_00;
  uint256 hash;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  CBlockIndex *this_00;
  CBlockIndex *pCVar7;
  Logger *pLVar8;
  undefined8 uVar9;
  SignalInterrupt *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> pcursor;
  pair<unsigned_char,_uint256> key;
  string log_msg;
  undefined4 uVar10;
  _Head_base<0UL,_CDBIterator_*,_false> local_248 [2];
  string local_238;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  CDiskBlockIndex local_1f8;
  pair<unsigned_char,_uint256> local_138;
  undefined1 local_108 [28];
  uchar auStack_ec [8];
  uchar local_e4 [8];
  uchar auStack_dc [8];
  uchar local_d4 [8];
  uchar auStack_cc [16];
  uint32_t local_bc;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_248[0]._M_head_impl = CDBWrapper::NewIterator(&this->super_CDBWrapper);
  local_1f8.super_CBlockIndex.pskip._1_1_ = '\0';
  local_1f8.super_CBlockIndex.pskip._2_1_ = '\0';
  local_1f8.super_CBlockIndex.pskip._3_1_ = '\0';
  local_1f8.super_CBlockIndex.pskip._4_1_ = '\0';
  local_1f8.super_CBlockIndex.pskip._5_1_ = '\0';
  local_1f8.super_CBlockIndex.pskip._6_1_ = '\0';
  local_1f8.super_CBlockIndex.pskip._7_1_ = '\0';
  local_1f8.super_CBlockIndex.nHeight._0_1_ = '\0';
  local_1f8.super_CBlockIndex._25_7_ = 0;
  local_1f8.super_CBlockIndex.nDataPos._0_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._1_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._2_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._3_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._4_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._5_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._6_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._7_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._0_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._1_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._2_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._3_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._4_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._5_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._6_1_ = '\0';
  local_1f8.super_CBlockIndex.pprev._7_1_ = '\0';
  local_1f8.super_CBlockIndex.pskip._0_1_ = '\0';
  local_1f8.super_CBlockIndex.phashBlock._0_1_ = 'b';
  CDBIterator::Seek<std::pair<unsigned_char,uint256>>
            (local_248[0]._M_head_impl,(pair<unsigned_char,_uint256> *)&local_1f8);
  do {
    bVar5 = CDBIterator::Valid(local_248[0]._M_head_impl);
    if ((!bVar5) || (bVar6 = util::SignalInterrupt::operator_cast_to_bool(in_RCX), bVar6)) {
      pcVar4 = (char *)CONCAT44(local_108._4_4_,local_108._0_4_);
      bVar5 = !bVar5;
LAB_00918457:
      local_108._0_8_ = pcVar4;
      std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr
                ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)local_248);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return bVar5;
      }
LAB_00918b54:
      __stack_chk_fail();
    }
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_138.first = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_138.second.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    bVar5 = CDBIterator::GetKey<std::pair<unsigned_char,uint256>>
                      (local_248[0]._M_head_impl,&local_138);
    pcVar4 = (char *)CONCAT44(local_108._4_4_,local_108._0_4_);
    if (!bVar5 || local_138.first != 'b') {
      bVar5 = true;
      goto LAB_00918457;
    }
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[6] = 0;
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[7] = 0;
    local_1f8.super_CBlockIndex.nTx = 0;
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[2] = 0;
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[3] = 0;
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[4] = 0;
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[5] = 0;
    local_1f8.super_CBlockIndex.nDataPos._0_1_ = '\0';
    local_1f8.super_CBlockIndex._33_7_ = 0;
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[0] = 0;
    local_1f8.super_CBlockIndex.nChainWork.super_base_uint<256U>.pn[1] = 0;
    local_1f8.super_CBlockIndex.pskip._0_1_ = '\0';
    local_1f8.super_CBlockIndex.pskip._1_1_ = '\0';
    local_1f8.super_CBlockIndex.pskip._2_1_ = '\0';
    local_1f8.super_CBlockIndex.pskip._3_1_ = '\0';
    local_1f8.super_CBlockIndex.pskip._4_1_ = '\0';
    local_1f8.super_CBlockIndex.pskip._5_1_ = '\0';
    local_1f8.super_CBlockIndex.pskip._6_1_ = '\0';
    local_1f8.super_CBlockIndex.pskip._7_1_ = '\0';
    local_1f8.super_CBlockIndex.nHeight._0_1_ = '\0';
    local_1f8.super_CBlockIndex._25_7_ = 0;
    local_1f8.super_CBlockIndex.phashBlock._0_1_ = '\0';
    local_1f8.super_CBlockIndex.phashBlock._1_1_ = '\0';
    local_1f8.super_CBlockIndex.phashBlock._2_1_ = '\0';
    local_1f8.super_CBlockIndex.phashBlock._3_1_ = '\0';
    local_1f8.super_CBlockIndex.phashBlock._4_1_ = '\0';
    local_1f8.super_CBlockIndex.phashBlock._5_1_ = '\0';
    local_1f8.super_CBlockIndex.phashBlock._6_1_ = '\0';
    local_1f8.super_CBlockIndex.phashBlock._7_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._0_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._1_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._2_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._3_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._4_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._5_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._6_1_ = '\0';
    local_1f8.super_CBlockIndex.pprev._7_1_ = '\0';
    local_1f8._160_4_ = 0;
    local_1f8._164_1_ = '\0';
    local_1f8._165_1_ = '\0';
    local_1f8._166_1_ = '\0';
    local_1f8._167_1_ = '\0';
    local_1f8._168_1_ = '\0';
    local_1f8._169_1_ = '\0';
    local_1f8._170_1_ = '\0';
    local_1f8._171_1_ = '\0';
    local_1f8._172_4_ = 0;
    local_1f8.super_CBlockIndex.nTimeMax = 0;
    local_1f8.super_CBlockIndex._148_1_ = '\0';
    local_1f8.super_CBlockIndex._149_1_ = '\0';
    local_1f8.super_CBlockIndex._150_1_ = '\0';
    local_1f8.super_CBlockIndex._151_1_ = '\0';
    local_1f8._152_1_ = '\0';
    local_1f8._153_1_ = '\0';
    local_1f8._154_1_ = '\0';
    local_1f8._155_1_ = '\0';
    local_1f8._156_1_ = '\0';
    local_1f8._157_1_ = '\0';
    local_1f8._158_1_ = '\0';
    local_1f8._159_1_ = '\0';
    local_1f8.super_CBlockIndex.nTime = 0;
    local_1f8.super_CBlockIndex.nBits = 0;
    local_1f8.super_CBlockIndex.nNonce = 0;
    local_1f8.super_CBlockIndex.nSequenceId = 0;
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
    local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
    local_1f8.super_CBlockIndex.m_chain_tx_count = 0;
    local_1f8.super_CBlockIndex.nStatus = 0;
    local_1f8.super_CBlockIndex.nVersion = 0;
    local_1f8._176_4_ = 0;
    bVar5 = CDBIterator::GetValue<CDiskBlockIndex>(local_248[0]._M_head_impl,&local_1f8);
    if (!bVar5) {
      pLVar8 = LogInstance();
      bVar5 = BCLog::Logger::Enabled(pLVar8);
      pcVar4 = (char *)CONCAT44(local_108._4_4_,local_108._0_4_);
      if (bVar5) {
        local_108[8] = '\0';
        local_108[9] = '\0';
        local_108[10] = '\0';
        local_108[0xb] = '\0';
        local_108[0xc] = '\0';
        local_108[0xd] = '\0';
        local_108[0xe] = '\0';
        local_108[0xf] = '\0';
        local_108._16_4_ = local_108._16_4_ & 0xffffff00;
        local_108._0_8_ = local_108 + 0x10;
        tinyformat::format<char[19]>
                  (&local_58,"%s: failed to read value\n",(char (*) [19])"LoadBlockIndexGuts");
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   &local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pLVar8 = LogInstance();
        str._M_len._4_4_ = local_108._12_4_;
        str._M_len._0_4_ = local_108._8_4_;
        local_58._M_dataplus._M_p = (pointer)0x5e;
        local_58._M_string_length = 0xfa6684;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file._M_len = 0x5e;
        str._M_str = (char *)local_108._0_8_;
        logging_function._M_str = "LoadBlockIndexGuts";
        logging_function._M_len = 0x12;
        BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x8d,ALL,Error);
        pcVar4 = (char *)local_108._0_8_;
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          local_238.field_2._M_allocated_capacity = CONCAT44(local_108._20_4_,local_108._16_4_);
LAB_0091844c:
          operator_delete((void *)local_108._0_8_,local_238.field_2._M_allocated_capacity + 1);
          local_108._0_8_ = pcVar4;
          pcVar4 = (char *)local_108._0_8_;
        }
      }
LAB_00918454:
      bVar5 = false;
      goto LAB_00918457;
    }
    local_108._0_4_ = local_1f8.super_CBlockIndex.nVersion;
    auStack_ec._4_4_ = local_1f8._176_4_;
    auStack_ec._0_4_ = local_1f8._172_4_;
    local_108._20_4_ = local_1f8._164_4_;
    local_108._24_4_ = local_1f8._168_4_;
    local_108._4_4_ = local_1f8.super_CBlockIndex._148_4_;
    local_108._8_4_ = local_1f8._152_4_;
    local_108._12_4_ = local_1f8._156_4_;
    local_108._16_4_ = local_1f8._160_4_;
    local_d4[0] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x10];
    local_d4[1] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x11];
    local_d4[2] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x12];
    local_d4[3] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x13];
    local_d4[4] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x14];
    local_d4[5] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x15];
    local_d4[6] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x16];
    local_d4[7] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0x17];
    auStack_cc[0] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18];
    auStack_cc[1] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19];
    auStack_cc[2] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a];
    auStack_cc[3] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b];
    auStack_cc[4] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c];
    auStack_cc[5] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d];
    auStack_cc[6] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e];
    auStack_cc[7] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f];
    local_e4[0] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [0];
    local_e4[1] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [1];
    local_e4[2] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [2];
    local_e4[3] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [3];
    local_e4[4] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [4];
    local_e4[5] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [5];
    local_e4[6] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [6];
    local_e4[7] = local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
                  [7];
    auStack_dc[0] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8];
    auStack_dc[1] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9];
    auStack_dc[2] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10];
    auStack_dc[3] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb];
    auStack_dc[4] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc];
    auStack_dc[5] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd];
    auStack_dc[6] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe];
    auStack_dc[7] =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf];
    auStack_cc._12_4_ = local_1f8.super_CBlockIndex.nBits;
    auStack_cc._8_4_ = local_1f8.super_CBlockIndex.nTime;
    local_bc = local_1f8.super_CBlockIndex.nNonce;
    CBlockHeader::GetHash((uint256 *)&local_58,(CBlockHeader *)local_108);
    lVar1._0_4_ = interrupt[1].m_pipe_r;
    lVar1._4_4_ = interrupt[1].m_pipe_w;
    if (lVar1 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        std::__throw_bad_function_call();
LAB_009185a6:
        __assert_fail("phashBlock != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                      ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
      }
      goto LAB_00918b54;
    }
    this_00 = (CBlockIndex *)(**(code **)(interrupt + 2))(interrupt,&local_58);
    lVar2._0_4_ = interrupt[1].m_pipe_r;
    lVar2._4_4_ = interrupt[1].m_pipe_w;
    if (lVar2 == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar9 = std::__throw_bad_function_call();
        if ((SignalInterrupt *)CONCAT44(local_108._4_4_,local_108._0_4_) != interrupt) {
          operator_delete((SignalInterrupt *)CONCAT44(local_108._4_4_,local_108._0_4_),
                          CONCAT44(local_108._20_4_,local_108._16_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        std::unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_>::~unique_ptr
                  ((unique_ptr<CDBIterator,_std::default_delete<CDBIterator>_> *)local_248);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          _Unwind_Resume(uVar9);
        }
      }
      goto LAB_00918b54;
    }
    pCVar7 = (CBlockIndex *)
             (**(code **)(interrupt + 2))(interrupt,&local_1f8.super_CBlockIndex.field_0x94);
    this_00->pprev = pCVar7;
    this_00->nHeight =
         (int)CONCAT71(local_1f8.super_CBlockIndex._25_7_,(uchar)local_1f8.super_CBlockIndex.nHeight
                      );
    this_00->nFile = local_1f8.super_CBlockIndex.nFile;
    this_00->nDataPos =
         (int)CONCAT71(local_1f8.super_CBlockIndex._33_7_,
                       (uchar)local_1f8.super_CBlockIndex.nDataPos);
    this_00->nUndoPos = local_1f8.super_CBlockIndex.nUndoPos;
    this_00->nVersion = local_1f8.super_CBlockIndex.nVersion;
    *(undefined8 *)(this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 8) =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x10) =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_8_;
    *(undefined8 *)((this_00->hashMerkleRoot).super_base_blob<256U>.m_data._M_elems + 0x18) =
         local_1f8.super_CBlockIndex.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_8_;
    this_00->nTime = local_1f8.super_CBlockIndex.nTime;
    this_00->nBits = local_1f8.super_CBlockIndex.nBits;
    this_00->nNonce = local_1f8.super_CBlockIndex.nNonce;
    this_00->nStatus = local_1f8.super_CBlockIndex.nStatus;
    this_00->nTx = local_1f8.super_CBlockIndex.nTx;
    puVar3 = this_00->phashBlock;
    if (puVar3 == (uint256 *)0x0) goto LAB_009185a6;
    local_218 = *(undefined8 *)(puVar3->super_base_blob<256U>).m_data._M_elems;
    uStack_210 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 8);
    local_208 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_200 = *(undefined8 *)((puVar3->super_base_blob<256U>).m_data._M_elems + 0x18);
    uVar10 = (undefined4)((ulong)uStack_200 >> 0x20);
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] = (char)uVar10;
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] = (char)((uint)uVar10 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] = (char)((uint)uVar10 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] = (char)((uint)uVar10 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems._0_28_ =
         *(undefined1 (*) [28])(puVar3->super_base_blob<256U>).m_data._M_elems;
    bVar5 = CheckProofOfWork(hash,local_1f8.super_CBlockIndex.nBits,consensusParams);
    if (!bVar5) {
      CBlockIndex::ToString_abi_cxx11_(&local_238,this_00);
      pLVar8 = LogInstance();
      bVar5 = BCLog::Logger::Enabled(pLVar8);
      pcVar4 = (char *)CONCAT44(local_108._4_4_,local_108._0_4_);
      if (bVar5) {
        local_108[8] = '\0';
        local_108[9] = '\0';
        local_108[10] = '\0';
        local_108[0xb] = '\0';
        local_108[0xc] = '\0';
        local_108[0xd] = '\0';
        local_108[0xe] = '\0';
        local_108[0xf] = '\0';
        local_108._16_4_ = local_108._16_4_ & 0xffffff00;
        local_108._0_8_ = local_108 + 0x10;
        tinyformat::format<char[19],std::__cxx11::string>
                  (&local_58,(tinyformat *)"%s: CheckProofOfWork failed: %s\n","LoadBlockIndexGuts",
                   (char (*) [19])&local_238,in_R8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   &local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        pLVar8 = LogInstance();
        str_00._M_len._4_4_ = local_108._12_4_;
        str_00._M_len._0_4_ = local_108._8_4_;
        local_58._M_dataplus._M_p = (pointer)0x5e;
        local_58._M_string_length = 0xfa6684;
        source_file_00._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/blockstorage.cpp"
        ;
        source_file_00._M_len = 0x5e;
        str_00._M_str = (char *)local_108._0_8_;
        logging_function_00._M_str = "LoadBlockIndexGuts";
        logging_function_00._M_len = 0x12;
        BCLog::Logger::LogPrintStr(pLVar8,str_00,logging_function_00,source_file_00,0x87,ALL,Error);
        pcVar4 = (char *)local_108._0_8_;
        if ((undefined1 *)local_108._0_8_ != local_108 + 0x10) {
          operator_delete((void *)local_108._0_8_,CONCAT44(local_108._20_4_,local_108._16_4_) + 1);
          pcVar4 = (char *)local_108._0_8_;
        }
      }
      local_108._0_8_ = local_238._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) goto LAB_0091844c;
      goto LAB_00918454;
    }
    CDBIterator::Next(local_248[0]._M_head_impl);
  } while( true );
}

Assistant:

bool BlockTreeDB::LoadBlockIndexGuts(const Consensus::Params& consensusParams, std::function<CBlockIndex*(const uint256&)> insertBlockIndex, const util::SignalInterrupt& interrupt)
{
    AssertLockHeld(::cs_main);
    std::unique_ptr<CDBIterator> pcursor(NewIterator());
    pcursor->Seek(std::make_pair(DB_BLOCK_INDEX, uint256()));

    // Load m_block_index
    while (pcursor->Valid()) {
        if (interrupt) return false;
        std::pair<uint8_t, uint256> key;
        if (pcursor->GetKey(key) && key.first == DB_BLOCK_INDEX) {
            CDiskBlockIndex diskindex;
            if (pcursor->GetValue(diskindex)) {
                // Construct block index object
                CBlockIndex* pindexNew = insertBlockIndex(diskindex.ConstructBlockHash());
                pindexNew->pprev          = insertBlockIndex(diskindex.hashPrev);
                pindexNew->nHeight        = diskindex.nHeight;
                pindexNew->nFile          = diskindex.nFile;
                pindexNew->nDataPos       = diskindex.nDataPos;
                pindexNew->nUndoPos       = diskindex.nUndoPos;
                pindexNew->nVersion       = diskindex.nVersion;
                pindexNew->hashMerkleRoot = diskindex.hashMerkleRoot;
                pindexNew->nTime          = diskindex.nTime;
                pindexNew->nBits          = diskindex.nBits;
                pindexNew->nNonce         = diskindex.nNonce;
                pindexNew->nStatus        = diskindex.nStatus;
                pindexNew->nTx            = diskindex.nTx;

                if (!CheckProofOfWork(pindexNew->GetBlockHash(), pindexNew->nBits, consensusParams)) {
                    LogError("%s: CheckProofOfWork failed: %s\n", __func__, pindexNew->ToString());
                    return false;
                }

                pcursor->Next();
            } else {
                LogError("%s: failed to read value\n", __func__);
                return false;
            }
        } else {
            break;
        }
    }

    return true;
}